

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

void ON_Mesh_SetClosedHelper
               (bool bClosedOnly,ON_Mesh *mesh,char *m_mesh_is_manifold,char *m_mesh_is_oriented)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  uint **memblock;
  ON_3udex *e;
  ON_MeshFace *pOVar7;
  ON_MeshFace *pOVar8;
  ON_3udex *pOVar9;
  uint **local_490;
  ON_MeshFace *F;
  uint E_count;
  int *fvi;
  uint Vid0;
  ON_3udex E;
  ON_3udex *E_list;
  uint *Vid;
  uint Vidbuffer [256];
  uint local_40;
  uint local_3c;
  uint j;
  uint i;
  uint Fcount;
  uint Vcount;
  char is_oriented;
  char is_manifold;
  int is_closed;
  char *m_mesh_is_oriented_local;
  char *m_mesh_is_manifold_local;
  ON_Mesh *mesh_local;
  bool bClosedOnly_local;
  
  Vcount = 0;
  Fcount._3_1_ = '\x02';
  Fcount._2_1_ = '\x02';
  uVar5 = ON_SimpleArray<ON_3fPoint>::UnsignedCount(&(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>);
  uVar6 = ON_SimpleArray<ON_MeshFace>::UnsignedCount(&mesh->m_F);
  mesh_local._7_1_ = bClosedOnly;
  if ((uVar5 < 3) || (uVar6 == 0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
               ,0xe8b,"","Mesh is not valid.");
  }
  else if ((!bClosedOnly) || ((3 < uVar5 && (3 < uVar6)))) {
    if (uVar5 < 0x101) {
      local_490 = &Vid;
    }
    else {
      local_490 = (uint **)0x0;
    }
    memblock = (uint **)ON_Mesh::GetVertexLocationIds(mesh,1,(uint *)local_490,(uint *)0x0);
    if (memblock == (uint **)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                 ,0xe9d,"","Mesh has corrupt vertex information.");
      mesh_local._7_1_ = 0;
    }
    else {
      e = (ON_3udex *)onmalloc((ulong)(uVar6 << 2) * 0xc);
      F._4_4_ = 0;
      pOVar7 = ON_SimpleArray<ON_MeshFace>::Array(&mesh->m_F);
      for (local_40 = 0; uVar5 = F._4_4_, local_40 < uVar6; local_40 = local_40 + 1) {
        pOVar8 = pOVar7 + local_40;
        uVar1 = *(uint *)((long)memblock + (long)pOVar8->vi[0] * 4);
        uVar2 = *(uint *)((long)memblock + (long)pOVar8->vi[1] * 4);
        stack0xfffffffffffffb9c = CONCAT44(uVar2,uVar1);
        if (uVar1 == uVar2) break;
        if (uVar2 < uVar1) {
          stack0xfffffffffffffb9c = CONCAT44(uVar1,uVar2);
        }
        E.i = (uint)(uVar2 < uVar1);
        pOVar9 = e + F._4_4_;
        pOVar9->i = fvi._4_4_;
        pOVar9->j = Vid0;
        pOVar9->k = E.i;
        uVar1 = *(uint *)((long)memblock + (long)pOVar8->vi[2] * 4);
        stack0xfffffffffffffb9c = CONCAT44(uVar1,uVar2);
        uVar5 = F._4_4_ + 1;
        if (uVar2 == uVar1) break;
        if (uVar1 < uVar2) {
          stack0xfffffffffffffb9c = CONCAT44(uVar2,uVar1);
        }
        E.i = (uint)(uVar1 < uVar2);
        uVar5 = F._4_4_ + 2;
        pOVar9 = e + (F._4_4_ + 1);
        pOVar9->i = fvi._4_4_;
        pOVar9->j = Vid0;
        pOVar9->k = E.i;
        fvi._0_4_ = uVar1;
        if (pOVar8->vi[2] != pOVar8->vi[3]) {
          fvi._0_4_ = *(uint *)((long)memblock + (long)pOVar8->vi[3] * 4);
          stack0xfffffffffffffb9c = CONCAT44((uint)fvi,uVar1);
          if (uVar1 == (uint)fvi) break;
          if ((uint)fvi < uVar1) {
            stack0xfffffffffffffb9c = CONCAT44(uVar1,(uint)fvi);
          }
          E.i = (uint)((uint)fvi < uVar1);
          pOVar9 = e + uVar5;
          pOVar9->i = fvi._4_4_;
          pOVar9->j = Vid0;
          pOVar9->k = E.i;
          uVar5 = F._4_4_ + 3;
        }
        F._4_4_ = uVar5;
        uVar1 = *(uint *)((long)memblock + (long)pOVar8->vi[0] * 4);
        stack0xfffffffffffffb9c = CONCAT44(uVar1,(uint)fvi);
        uVar5 = F._4_4_;
        if ((uint)fvi == uVar1) break;
        if (uVar1 < (uint)fvi) {
          stack0xfffffffffffffb9c = CONCAT44((uint)fvi,uVar1);
        }
        E.i = (uint)(uVar1 < (uint)fvi);
        pOVar9 = e + F._4_4_;
        pOVar9->i = fvi._4_4_;
        pOVar9->j = Vid0;
        pOVar9->k = E.i;
        F._4_4_ = F._4_4_ + 1;
      }
      F._4_4_ = uVar5;
      if (memblock != &Vid) {
        onfree(memblock);
      }
      if ((F._4_4_ < 3) || (local_40 != uVar6)) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                   ,0xef1,"","Mesh is corrupt or collapsed");
        mesh_local._7_1_ = 0;
      }
      else {
        ON_hsort_3udex(e,(ulong)F._4_4_);
        Vcount = (uint)(3 < uVar6 && 5 < F._4_4_);
        Fcount._2_1_ = '\x01';
        Fcount._3_1_ = '\x01';
        local_3c = 0;
        if ((!bClosedOnly) || (Vcount == 1)) {
          local_3c = 0;
          uVar5 = local_3c;
          do {
            while( true ) {
              local_3c = uVar5;
              if (F._4_4_ <= local_3c) goto LAB_0070dc7c;
              pOVar9 = e + local_3c;
              uVar3 = pOVar9->i;
              uVar4 = pOVar9->j;
              uVar5 = local_3c + 1;
              if (F._4_4_ <= uVar5) {
                Vcount = 0;
                local_3c = uVar5;
                goto LAB_0070dc7c;
              }
              if ((uVar3 != e[uVar5].i) || (uVar4 != e[uVar5].j)) break;
              if (pOVar9->k == e[uVar5].k) {
                Fcount._2_1_ = '\x02';
              }
              uVar5 = local_3c + 2;
              if (((uVar5 < F._4_4_) && (uVar3 == e[uVar5].i)) && (uVar4 == e[uVar5].j)) {
                Fcount._2_1_ = '\x02';
                Fcount._3_1_ = '\x02';
                if (Vcount == 0) {
                  mesh_local._7_1_ = 0;
                  local_3c = uVar5;
                  goto LAB_0070dc7c;
                }
                local_3c = local_3c + 3;
                while (((uVar5 = local_3c, local_3c < F._4_4_ && (uVar3 == e[local_3c].i)) &&
                       (uVar4 == e[local_3c].j))) {
                  local_3c = local_3c + 1;
                }
              }
            }
            Vcount = 0;
            if ((Fcount._2_1_ == '\x02') && (Fcount._3_1_ == '\x02')) {
              mesh_local._7_1_ = 0;
              local_3c = uVar5;
              break;
            }
            local_3c = uVar5;
          } while (!bClosedOnly);
        }
LAB_0070dc7c:
        if ((F._4_4_ != 0) && (F._4_4_ <= local_3c)) {
          mesh_local._7_1_ = 0;
        }
        onfree(e);
      }
    }
  }
  ON_Mesh::SetClosed(mesh,Vcount);
  if ((mesh_local._7_1_ & 1) == 0) {
    if (Fcount._3_1_ == '\x02') {
      Fcount._2_1_ = '\x02';
    }
    *m_mesh_is_manifold = Fcount._3_1_;
    *m_mesh_is_oriented = Fcount._2_1_;
  }
  return;
}

Assistant:

static void ON_Mesh_SetClosedHelper( 
          bool bClosedOnly,
          const ON_Mesh& mesh,
          const char& m_mesh_is_manifold,
          const char& m_mesh_is_oriented
          )
{
  // thread safe lazy evaluation for mesh's m_mesh_is_... flags
  // Sets: m_mesh_is_closed.
  //       If bClosedOnly is false, also sets m_mesh_is_manifold and m_mesh_is_oriented
  int is_closed = 0;
  char is_manifold = 2;
  char is_oriented = 2;
  for (;;)
  {
    const unsigned int Vcount = mesh.m_V.UnsignedCount();
    const unsigned int Fcount = mesh.m_F.UnsignedCount();
    if ( Vcount < 3 || Fcount < 1 )
    {
      ON_ERROR("Mesh is not valid.");
      break;
    }
    if ( bClosedOnly && (Vcount < 4 || Fcount < 4) )
    {
      // not closed - don't waste any more time.
      break;
    }

    unsigned int i, j;
    unsigned int Vidbuffer[256];
    unsigned int* Vid = mesh.GetVertexLocationIds(
                     1,
                     (Vcount*sizeof(*Vid) <= sizeof(Vidbuffer) ? &Vidbuffer[0] : nullptr),
                     nullptr // unwanted Vindex[] values
                    );
    if ( 0 == Vid )
    {
      ON_ERROR("Mesh has corrupt vertex information.");
      bClosedOnly = false;
      break;
    }

    // build an edge list where the "vertex" indices identify unique 3d locations
    ON_3udex* E_list = (ON_3udex*)onmalloc(4 * Fcount*sizeof(E_list[0]));
    ON_3udex E;
    unsigned int Vid0;
    const int* fvi;
    unsigned int E_count = 0;
    const ON_MeshFace* F = mesh.m_F.Array();
    for ( j = 0; j < Fcount; j++ )
    {
      fvi = F[j].vi;
      E.i = Vid[fvi[0]];
      Vid0 = E.j = Vid[fvi[1]];
      if ( E.i == E.j )
        break;
      if ( E.i > E.j )
      {
        i = E.i; E.i = E.j; E.j = i;
        E.k = 1;
      }
      else
      {
        E.k = 0;
      }
      E_list[E_count++] = E;

      E.i = Vid0;
      Vid0 = E.j = Vid[fvi[2]];
      if ( E.i == E.j )
        break;
      if ( E.i > E.j )
      {
        i = E.i; E.i = E.j; E.j = i;
        E.k = 1;
      }
      else
      {
        E.k = 0;
      }
      E_list[E_count++] = E;

      if ( fvi[2] != fvi[3] )
      {
        // quad
        E.i = Vid0;
        Vid0 = E.j = Vid[fvi[3]];
        if ( E.i == E.j )
          break;
        if ( E.i > E.j )
        {
          i = E.i; E.i = E.j; E.j = i;
          E.k = 1;
        }
        else
        {
          E.k = 0;
        }
        E_list[E_count++] = E;
      }

      E.i = Vid0;
      E.j = Vid[fvi[0]];
      if ( E.i == E.j )
        break;
      if ( E.i > E.j )
      {
        i = E.i; E.i = E.j; E.j = i;
        E.k = 1;
      }
      else
      {
        E.k = 0;
      }
      E_list[E_count++] = E;
    }
    if ( Vid != &Vidbuffer[0] )
      onfree(Vid);

    if ( E_count < 3 || j != Fcount )
    {
      ON_ERROR("Mesh is corrupt or collapsed");
      bClosedOnly = false;
      break;
    }

    // sort the the edges
    ON_hsort_3udex(E_list,E_count);

    // Look for duplicate edges.  If we find an edge with no duplicate,
    // then the mesh is open.  It is possible that degenerate meshes,
    // like a flattened box, will be flagged as closed.
    is_closed = (Fcount >= 4 && E_count >= 6) ? 1 : 0;
    is_oriented = 1;
    is_manifold = 1;
    i = 0;
    if ( !bClosedOnly || 1 == is_closed ) for ( i = 0; i < E_count; /*empty iterator*/ )
    {
      E = E_list[i];
      if ( ++i >= E_count )
      {
        // boundary edge (and the last edge in our list)
        is_closed = 0;
        break;
      }

      if ( E.i != E_list[i].i || E.j != E_list[i].j )
      {
        // boundary edge
        is_closed = 0;
        if ( 2 == is_oriented && 2 == is_manifold )
        {
          bClosedOnly = false;
          break;
        }
        if ( bClosedOnly )
          break; // don't spend time with further testing
        continue;
      }

      if ( E.k == E_list[i].k )
      {
        // opposite face normals along this edge - mesh is not oriented
        is_oriented = 2; 
      }

      if ( ++i >= E_count || E.i != E_list[i].i || E.j != E_list[i].j )
      {
        // two faces share this edge
        continue;
      }

      // three or more faces share this edge - mesh is not oriented manifold
      is_oriented = 2; 
      is_manifold = 2; 
      if ( 0 == is_closed )
      {
        bClosedOnly = false;
        break;
      }

      // Check for more faces sharing this edge.
      for ( i++; i < E_count; i++ )
      {
        if ( E.i != E_list[i].i || E.j != E_list[i].j )
        {
          // the edges E and Eid_list[i] are in different locations
          break;
        }
      }
    }
    if (E_count > 0 && i >= E_count)
    {
      // is_manifold and is_oriented are set correctly
      bClosedOnly = false;
    }

    onfree(E_list);

    break;
  }

  const_cast<ON_Mesh&>(mesh).SetClosed(is_closed);
  if ( !bClosedOnly )
  {
    // is_manifold and is_oriented are set correctly
    if ( 2 == is_manifold )
      is_oriented = 2;
    const_cast<char&>(m_mesh_is_manifold) = is_manifold;
    const_cast<char&>(m_mesh_is_oriented) = is_oriented;
  }
}